

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V5_TextExtra *
ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject *pText,bool bCreate)

{
  bool bVar1;
  ON_OBSOLETE_V5_TextExtra *pOVar2;
  ON_OBSOLETE_V5_TextExtra *pOVar3;
  ON_UUID local_30;
  
  if (pText != (ON_OBSOLETE_V5_TextObject *)0x0) {
    local_30 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_TextExtra_class_rtti);
    pOVar2 = (ON_OBSOLETE_V5_TextExtra *)ON_Object::GetUserData((ON_Object *)pText,&local_30);
    if (pOVar2 == (ON_OBSOLETE_V5_TextExtra *)0x0) {
      pOVar3 = (ON_OBSOLETE_V5_TextExtra *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar2,&m_ON_OBSOLETE_V5_TextExtra_class_rtti);
      pOVar3 = (ON_OBSOLETE_V5_TextExtra *)0x0;
      if (bVar1) {
        pOVar3 = pOVar2;
      }
    }
    if (!bCreate || pOVar3 != (ON_OBSOLETE_V5_TextExtra *)0x0) {
      return pOVar3;
    }
    pOVar2 = (ON_OBSOLETE_V5_TextExtra *)operator_new(0xf0);
    ON_OBSOLETE_V5_TextExtra(pOVar2);
    bVar1 = ON_Object::AttachUserData((ON_Object *)pText,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_OBSOLETE_V5_TextExtra *)0x0;
}

Assistant:

ON_OBSOLETE_V5_TextExtra* ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject* pText, bool bCreate)
{
  ON_OBSOLETE_V5_TextExtra* pExtra = 0;
  if(pText)
  {
    pExtra = ON_OBSOLETE_V5_TextExtra::Cast(pText->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_TextExtra)));
    if(pExtra == 0 && bCreate)
    {
      pExtra = new ON_OBSOLETE_V5_TextExtra;
      if(pExtra)
      {
        if(!pText->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}